

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O0

char (*) [19] query_str<char_const(&)[19]>(char (*prompt) [19])

{
  ostream *this;
  char *in_RSI;
  char (*prompt_local) [19];
  string *input;
  
  this = std::operator<<((ostream *)&std::cout,in_RSI);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)prompt);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)prompt);
  return prompt;
}

Assistant:

std::string query_str(T && prompt)
{
    std::cout << std::forward<T>(prompt) << std::flush;

    std::string input;
    std::getline(std::cin, input);

    return input;
}